

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

size_t __thiscall c4::yml::Tree::child(Tree *this,size_t node,size_t pos)

{
  code *pcVar1;
  Location LVar2;
  bool bVar3;
  size_t sVar4;
  long lVar5;
  char msg [29];
  char local_38 [32];
  
  if (node == 0xffffffffffffffff) {
    builtin_strncpy(local_38 + 0x10,"ode != NONE)",0xd);
    builtin_strncpy(local_38,"check failed: (n",0x10);
    if (((s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar1 = (code *)swi(3);
      sVar4 = (*pcVar1)();
      return sVar4;
    }
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x677b) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x677b) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_38,0x1d,LVar2,(this->m_callbacks).m_user_data);
  }
  sVar4 = first_child(this,node);
  if (pos != 0 && sVar4 != 0xffffffffffffffff) {
    lVar5 = pos - 1;
    do {
      sVar4 = next_sibling(this,sVar4);
      bVar3 = lVar5 != 0;
      lVar5 = lVar5 + -1;
      if (sVar4 == 0xffffffffffffffff) {
        return 0xffffffffffffffff;
      }
    } while (bVar3);
  }
  return sVar4;
}

Assistant:

size_t Tree::child(size_t node, size_t pos) const
{
    _RYML_CB_ASSERT(m_callbacks, node != NONE);
    size_t count = 0;
    for(size_t i = first_child(node); i != NONE; i = next_sibling(i))
    {
        if(count++ == pos)
            return i;
    }
    return NONE;
}